

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

string * wabt::anon_unknown_0::GetMemoryAPIString
                   (string *__return_storage_ptr__,Memory *memory,string *api)

{
  bool bVar1;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix._M_string_length = 0;
  suffix.field_2._M_local_buf[0] = '\0';
  if ((memory->page_limits).is_shared == true) {
    std::__cxx11::string::append((char *)&suffix);
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)api);
  bVar1 = std::operator!=(&local_48,"wasm_rt_");
  if ((bVar1) && (memory->page_size == 0x10000)) {
    bVar1 = (memory->page_limits).is_64;
    std::__cxx11::string::_M_dispose();
    if (bVar1 == false) {
      std::__cxx11::string::append((char *)&suffix);
    }
  }
  else {
    std::__cxx11::string::_M_dispose();
  }
  std::operator+(__return_storage_ptr__,api,&suffix);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

static std::string GetMemoryAPIString(const Memory& memory, std::string api) {
  std::string suffix;
  if (memory.page_limits.is_shared) {
    suffix += "_shared";
  }

  // Memory load and store routines can be optimized for default-page-size,
  // 32-bit memories (by using hardware to bounds-check memory access).
  // Append "_default32" to these function names to choose the (possibly) fast
  // path.
  //
  // We don't need to do this for runtime routines; those can check the
  // wasm_rt_memory_t structure.
  if (api.substr(0, 8) != "wasm_rt_" &&
      memory.page_size == WABT_DEFAULT_PAGE_SIZE &&
      memory.page_limits.is_64 == false) {
    suffix += "_default32";
  }
  return api + suffix;
}